

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_init_do(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  CURLcode CVar2;
  uint uVar3;
  curltime cVar4;
  
  CVar2 = Curl_preconnect(data);
  if (CVar2 == CURLE_OK) {
    if (conn == (connectdata *)0x0) {
      uVar3 = *(uint *)&(data->state).field_0x6d0;
    }
    else {
      puVar1 = &(conn->bits).field_0x5;
      *puVar1 = *puVar1 & 0xdf;
      uVar3 = *(uint *)&(data->state).field_0x6d0;
      if (((uVar3 & 0x40) != 0) && ((conn->handler->flags & 0x1000) == 0)) {
        uVar3 = uVar3 & 0xffffffbf;
      }
    }
    *(uint *)&(data->state).field_0x6d0 = uVar3 & 0xfffff77f;
    if (((data->set).field_0x8e5 & 2) != 0) {
      (data->state).httpreq = '\x05';
    }
    cVar4 = Curl_now();
    (data->req).start.tv_sec = cVar4.tv_sec;
    (data->req).start.tv_usec = cVar4.tv_usec;
    (data->req).now.tv_sec = (data->req).start.tv_sec;
    (data->req).now.tv_usec = (data->req).start.tv_usec;
    *(undefined4 *)&(data->req).now.field_0xc = *(undefined4 *)&(data->req).start.field_0xc;
    (data->req).bytecount = 0;
    *(ushort *)&(data->req).field_0xd9 = (*(ushort *)&(data->req).field_0xd9 & 0xfff6) + 1;
    Curl_speedinit(data);
    Curl_pgrsSetUploadCounter(data,0);
    Curl_pgrsSetDownloadCounter(data,0);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_init_do(struct Curl_easy *data, struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;

  /* if this is a pushed stream, we need this: */
  CURLcode result = Curl_preconnect(data);
  if(result)
    return result;

  if(conn) {
    conn->bits.do_more = FALSE; /* by default there's no curl_do_more() to
                                   use */
    /* if the protocol used doesn't support wildcards, switch it off */
    if(data->state.wildcardmatch &&
       !(conn->handler->flags & PROTOPT_WILDCARD))
      data->state.wildcardmatch = FALSE;
  }

  data->state.done = FALSE; /* *_done() is not called yet */
  data->state.expect100header = FALSE;

  if(data->set.opt_no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->state.httpreq = HTTPREQ_HEAD;

  k->start = Curl_now(); /* start time */
  k->now = k->start;   /* current time is now */
  k->header = TRUE; /* assume header */
  k->bytecount = 0;
  k->ignorebody = FALSE;

  Curl_speedinit(data);
  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);

  return CURLE_OK;
}